

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

optional<pbrt::CameraRayDifferential> * __thiscall
pbrt::CameraHandle::GenerateRayDifferential
          (optional<pbrt::CameraRayDifferential> *__return_storage_ptr__,CameraHandle *this,
          CameraSample sample,SampledWavelengths *lambda)

{
  ulong uVar1;
  undefined7 uVar2;
  CameraHandle local_10;
  
  uVar2 = (undefined7)((ulong)lambda >> 8);
  uVar1 = (this->
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          ).bits;
  if ((ushort)(uVar1 >> 0x30) < 3) {
    if ((uVar1 & 0x3000000000000) == 0x2000000000000) {
      OrthographicCamera::GenerateRayDifferential
                (__return_storage_ptr__,(OrthographicCamera *)(uVar1 & 0xffffffffffff),sample,
                 (SampledWavelengths *)CONCAT71(uVar2,0x30));
    }
    else {
      PerspectiveCamera::GenerateRayDifferential
                (__return_storage_ptr__,(PerspectiveCamera *)(uVar1 & 0xffffffffffff),sample,
                 (SampledWavelengths *)CONCAT71(uVar2,0x30));
    }
  }
  else {
    if ((uVar1 & 0xfffe000000000000) == 0x2000000000000) {
      local_10.
      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
      .bits = (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
               )(uVar1 | 0x3000000000000);
    }
    else {
      local_10.
      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
      .bits = (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
               )(uVar1 & 0xffffffffffff | 0x4000000000000);
    }
    CameraBase::GenerateRayDifferential(__return_storage_ptr__,&local_10,sample,lambda);
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRayDifferential> CameraHandle::GenerateRayDifferential(
    CameraSample sample, SampledWavelengths &lambda) const {
    auto gen = [&](auto ptr) { return ptr->GenerateRayDifferential(sample, lambda); };
    return Dispatch(gen);
}